

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatIndexBuilder.cpp
# Opt level: O2

void flat_radixsort(vector<unsigned_long,_std::allocator<unsigned_long>_> *data,uint64_t max_fileid)

{
  int iVar1;
  int shift;
  uint shift_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> swap;
  allocator_type local_39;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,
             (long)(data->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(data->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3,&local_39);
  iVar1 = count_bytes((uint32_t)max_fileid);
  for (shift_00 = 0; shift_00 < 0x40; shift_00 = shift_00 + 8) {
    if ((int)shift_00 < iVar1 * 8 || 0x27 < shift_00) {
      countsort(data,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,shift_00);
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void flat_radixsort(std::vector<uint64_t> *data, uint64_t max_fileid) {
    std::vector<uint64_t> swap(data->size());
    int skip_to = count_bytes(max_fileid) * 8;
    for (int shift = 0; shift < 64; shift += 8) {
        if (shift >= skip_to && shift < 40) {
            continue;
        }
        countsort(data, &swap, shift);
    }
}